

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int luaopen_string(lua_State *L)

{
  lua_State *L_local;
  
  luaL_register(L,"string",strlib);
  lua_getfield(L,-1,"gmatch");
  lua_setfield(L,-2,"gfind");
  createmetatable(L);
  return 1;
}

Assistant:

LUALIB_API int luaopen_string (lua_State *L) {
  luaL_register(L, LUA_STRLIBNAME, strlib);
#if defined(LUA_COMPAT_GFIND)
  lua_getfield(L, -1, "gmatch");
  lua_setfield(L, -2, "gfind");
#endif
  createmetatable(L);
  return 1;
}